

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O3

char * __thiscall
google::protobuf::compiler::CodeGeneratorResponse::_InternalParse
          (CodeGeneratorResponse *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  Rep *pRVar5;
  CodeGeneratorResponse_File *msg;
  uint32 res;
  uint tag;
  int iVar6;
  string *s;
  char *ptr_00;
  pair<const_char_*,_unsigned_int> pVar7;
  pair<const_char_*,_bool> pVar8;
  
LAB_00219200:
  do {
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
      if ((long)ptr - (long)(ctx->super_EpsCopyInputStream).buffer_end_ ==
          (long)(ctx->super_EpsCopyInputStream).limit_) {
        return (char *)(byte *)ptr;
      }
      pVar8 = internal::EpsCopyInputStream::DoneFallback
                        (&ctx->super_EpsCopyInputStream,ptr,ctx->group_depth_);
      ptr = pVar8.first;
      if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        return (char *)(byte *)ptr;
      }
    }
    bVar1 = *ptr;
    pVar7.second._0_1_ = bVar1;
    pVar7.first = (char *)((byte *)ptr + 1);
    pVar7._9_7_ = 0;
    if ((char)bVar1 < '\0') {
      bVar2 = ((byte *)ptr)[1];
      res = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        pVar7 = internal::ReadTagFallback(ptr,res);
        if (pVar7.first == (char *)0x0) {
          return (char *)0x0;
        }
      }
      else {
        pVar7.second = res;
        pVar7.first = (char *)((byte *)ptr + 2);
        pVar7._12_4_ = 0;
      }
    }
    ptr_00 = pVar7.first;
    tag = pVar7.second;
    uVar4 = (uint)(pVar7._8_8_ >> 3) & 0x1fffffff;
    if (uVar4 == 0xf) {
      if ((char)pVar7.second == 'z') {
        ptr = ptr_00 + -1;
        do {
          pRVar5 = (this->file_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar5 == (Rep *)0x0) {
            iVar6 = (this->file_).super_RepeatedPtrFieldBase.total_size_;
LAB_002192b8:
            internal::RepeatedPtrFieldBase::Reserve
                      (&(this->file_).super_RepeatedPtrFieldBase,iVar6 + 1);
            pRVar5 = (this->file_).super_RepeatedPtrFieldBase.rep_;
            iVar6 = pRVar5->allocated_size;
LAB_002192c8:
            pRVar5->allocated_size = iVar6 + 1;
            msg = Arena::CreateMaybeMessage<google::protobuf::compiler::CodeGeneratorResponse_File>
                            ((this->file_).super_RepeatedPtrFieldBase.arena_);
            pRVar5 = (this->file_).super_RepeatedPtrFieldBase.rep_;
            iVar6 = (this->file_).super_RepeatedPtrFieldBase.current_size_;
            (this->file_).super_RepeatedPtrFieldBase.current_size_ = iVar6 + 1;
            pRVar5->elements[iVar6] = msg;
          }
          else {
            iVar3 = (this->file_).super_RepeatedPtrFieldBase.current_size_;
            iVar6 = pRVar5->allocated_size;
            if (iVar6 <= iVar3) {
              if (iVar6 == (this->file_).super_RepeatedPtrFieldBase.total_size_) goto LAB_002192b8;
              goto LAB_002192c8;
            }
            (this->file_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
            msg = (CodeGeneratorResponse_File *)pRVar5->elements[iVar3];
          }
          ptr = internal::ParseContext::
                ParseMessage<google::protobuf::compiler::CodeGeneratorResponse_File>
                          (ctx,msg,(char *)((byte *)ptr + 1));
          if ((byte *)ptr == (byte *)0x0) {
            return (char *)0x0;
          }
        } while ((ptr < (ctx->super_EpsCopyInputStream).limit_end_) && (*ptr == 0x7a));
        goto LAB_00219200;
      }
LAB_00219342:
      if ((tag == 0) || ((tag & 7) == 4)) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = tag - 1;
        return ptr_00;
      }
      ptr = internal::UnknownFieldParse(tag,&this->_internal_metadata_,ptr_00,ctx);
    }
    else {
      if ((uVar4 != 1) || ((char)pVar7.second != '\n')) goto LAB_00219342;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      s = (this->error_).ptr_;
      if (s == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstanceNoArena
                  (&this->error_,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        s = (this->error_).ptr_;
      }
      ptr = internal::InlineGreedyStringParser(s,ptr_00,ctx);
    }
    if ((byte *)ptr == (byte *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* CodeGeneratorResponse::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string error = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_error(), ptr, ctx, "google.protobuf.compiler.CodeGeneratorResponse.error");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.compiler.CodeGeneratorResponse.File file = 15;
      case 15:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 122)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_file(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<122>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}